

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall helics::CommonCore::setLoggingLevel(CommonCore *this,int logLevel)

{
  ActionMessage cmd;
  ActionMessage local_d0;
  
  ActionMessage::ActionMessage(&local_d0,cmd_core_configure);
  local_d0.dest_id.gid = (this->super_BrokerBase).global_id._M_i.gid;
  local_d0.messageID = 0x10f;
  local_d0.dest_handle.hid = logLevel;
  BrokerBase::addActionMessage(&this->super_BrokerBase,&local_d0);
  ActionMessage::~ActionMessage(&local_d0);
  return;
}

Assistant:

void CommonCore::setLoggingLevel(int logLevel)
{
    ActionMessage cmd(CMD_CORE_CONFIGURE);
    cmd.dest_id = global_id.load();
    cmd.messageID = defs::Properties::LOG_LEVEL;
    cmd.setExtraData(logLevel);
    addActionMessage(cmd);
}